

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

void __thiscall
CoreML::Specification::PermuteLayerParams::_internal_add_axis
          (PermuteLayerParams *this,uint64_t value)

{
  uint64_t local_18;
  uint64_t value_local;
  PermuteLayerParams *this_local;
  
  local_18 = value;
  value_local = (uint64_t)this;
  google::protobuf::RepeatedField<unsigned_long>::Add(&this->axis_,&local_18);
  return;
}

Assistant:

inline void PermuteLayerParams::_internal_add_axis(uint64_t value) {
  axis_.Add(value);
}